

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O0

int fy_diag_vprintf(fy_diag *diag,char *fmt,__va_list_tag *ap)

{
  char *pcStack_30;
  int rc;
  char *buf;
  __va_list_tag *ap_local;
  char *fmt_local;
  fy_diag *diag_local;
  
  if ((diag == (fy_diag *)0x0) || (fmt == (char *)0x0)) {
    diag_local._4_4_ = -1;
  }
  else if (((byte)diag->field_0x3c >> 1 & 1) == 0) {
    buf = (char *)ap;
    ap_local = (__va_list_tag *)fmt;
    fmt_local = (char *)diag;
    if ((diag->cfg).fp == (FILE *)0x0) {
      if ((diag->cfg).output_fn == (fy_diag_output_fn)0x0) {
        diag_local._4_4_ = -1;
      }
      else {
        diag_local._4_4_ = vasprintf(&stack0xffffffffffffffd0,fmt,ap);
        if (-1 < diag_local._4_4_) {
          (**(code **)(fmt_local + 8))
                    (fmt_local,*(undefined8 *)(fmt_local + 0x10),pcStack_30,(long)diag_local._4_4_);
          free(pcStack_30);
        }
      }
    }
    else {
      diag_local._4_4_ = vfprintf((FILE *)(diag->cfg).fp,fmt,ap);
    }
  }
  else {
    diag_local._4_4_ = 0;
  }
  return diag_local._4_4_;
}

Assistant:

int fy_diag_vprintf(struct fy_diag *diag, const char *fmt, va_list ap) {
    char *buf;
    int rc;

    if (!diag || !fmt)
        return -1;

    /* no more output */
    if (diag->destroyed)
        return 0;

    if (diag->cfg.fp)
        return vfprintf(diag->cfg.fp, fmt, ap);

    if (diag->cfg.output_fn) {
        rc = vasprintf(&buf, fmt, ap);
        if (rc < 0)
            return rc;
        diag->cfg.output_fn(diag, diag->cfg.user, buf, (size_t) rc);
        free(buf);
        return rc;
    }

    return -1;
}